

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
emplaceRealloc<std::pair<unsigned_long,unsigned_long>>
          (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *this,pointer pos,
          pair<unsigned_long,_unsigned_long> *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  unsigned_long uVar3;
  undefined8 uVar4;
  pointer ppVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar10 < uVar2 * 2) {
    uVar10 = uVar2 * 2;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    uVar10 = 0x7ffffffffffffff;
  }
  lVar11 = (long)pos - *(long *)this;
  puVar7 = (unsigned_long *)operator_new(uVar10 << 4);
  uVar3 = args->second;
  *(unsigned_long *)((long)puVar7 + lVar11) = args->first;
  ((unsigned_long *)((long)puVar7 + lVar11))[1] = uVar3;
  p = *(pointer *)this;
  lVar8 = *(long *)(this + 8) * 0x10;
  lVar9 = (long)p + (lVar8 - (long)pos);
  ppVar5 = p;
  puVar6 = puVar7;
  if (lVar9 == 0) {
    if (*(long *)(this + 8) != 0) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->first + lVar9);
        uVar4 = puVar1[1];
        *(undefined8 *)((long)puVar7 + lVar9) = *puVar1;
        ((undefined8 *)((long)puVar7 + lVar9))[1] = uVar4;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 != lVar9);
    }
  }
  else {
    for (; ppVar5 != pos; ppVar5 = ppVar5 + 1) {
      uVar3 = ppVar5->second;
      *puVar6 = ppVar5->first;
      puVar6[1] = uVar3;
      puVar6 = puVar6 + 2;
    }
    memcpy((void *)((long)puVar7 + lVar11 + 0x10),pos,(lVar9 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar10;
  *(unsigned_long **)this = puVar7;
  return (pointer)((long)puVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}